

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

void Wln_NtkCheckIntegrity(void *pData)

{
  Vec_Int_t *p;
  char *pcVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int Ent;
  int Fill;
  int Fill_00;
  int extraout_EDX;
  int iVar5;
  uint uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  bool bVar19;
  int *local_48;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  local_48 = (int *)malloc(400);
  p->pArray = local_48;
  lVar2 = *(long *)((long)pData + 0x10);
  if (3 < *(int *)(lVar2 + 8) + 2) {
    lVar3 = *(long *)((long)pData + 8);
    uVar7 = 3;
    do {
      iVar10 = (int)uVar7;
      lVar16 = (long)iVar10;
      if (*(char *)(lVar3 + lVar16) == '\x03') {
        Fill = iVar10 + 1;
        iVar9 = *(int *)(lVar2 + lVar16 * 4) + iVar10;
        iVar18 = -1;
        iVar5 = Fill;
        if (Fill < iVar9) {
          do {
            lVar12 = (long)iVar5;
            bVar4 = *(byte *)(lVar3 + lVar12);
            if (bVar4 == 5) {
              uVar15 = *(uint *)(lVar2 + lVar12 * 4);
              uVar8 = (ulong)uVar15;
              if (uVar8 != 0xffffffff) {
                iVar18 = uVar15 + 1;
                Vec_IntFillExtra(p,iVar18,Fill);
                if (((int)uVar15 < 0) || (p->nSize <= (int)uVar15)) goto LAB_00385264;
                iVar5 = Fill_00;
                if (0 < p->pArray[uVar8]) {
                  Vec_IntFillExtra(p,iVar18,Fill_00);
                  if (p->nSize <= (int)uVar15) goto LAB_00385264;
                  printf("Output name %d is used more than once (obj %d and obj %d).\n",
                         (ulong)uVar15,(ulong)(uint)p->pArray[uVar8],uVar7);
                  iVar5 = extraout_EDX;
                }
                Vec_IntFillExtra(p,iVar18,iVar5);
                if (p->nSize <= (int)uVar15) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                local_48 = p->pArray;
                local_48[uVar8] = iVar10;
                goto LAB_00385055;
              }
              break;
            }
            if (bVar4 == 0) goto LAB_00385245;
            iVar14 = 1;
            if (bVar4 < 4) {
              iVar14 = *(int *)(lVar2 + lVar12 * 4);
            }
            iVar5 = iVar5 + iVar14;
          } while (iVar5 < iVar9);
          do {
            lVar12 = (long)Fill;
            bVar4 = *(byte *)(lVar3 + lVar12);
            if (bVar4 == 6) {
              iVar18 = *(int *)(lVar2 + lVar12 * 4);
              if (iVar18 == 4) goto LAB_00385055;
              break;
            }
            if (bVar4 == 0) goto LAB_00385245;
            iVar5 = 1;
            if (bVar4 < 4) {
              iVar5 = *(int *)(lVar2 + lVar12 * 4);
            }
            Fill = Fill + iVar5;
          } while (Fill < iVar9);
        }
        pcVar1 = Abc_OperName(iVar18);
        printf("Internal object %d of type %s has no output name.\n",uVar7,pcVar1);
      }
      else if (*(char *)(lVar3 + lVar16) == '\0') goto LAB_00385245;
LAB_00385055:
      lVar3 = *(long *)((long)pData + 8);
      if (*(byte *)(lVar3 + lVar16) == 0) goto LAB_00385245;
      lVar2 = *(long *)((long)pData + 0x10);
      iVar18 = 1;
      if (*(byte *)(lVar3 + lVar16) < 4) {
        iVar18 = *(int *)(lVar2 + lVar16 * 4);
      }
      uVar7 = (ulong)(uint)(iVar10 + iVar18);
      iVar5 = *(int *)(lVar2 + 8) + 2;
    } while (iVar10 + iVar18 < iVar5);
    if (3 < iVar5) {
      lVar3 = *(long *)((long)pData + 8);
      uVar15 = 3;
      do {
        lVar16 = (long)(int)uVar15;
        bVar4 = *(byte *)(lVar3 + lVar16);
        if (bVar4 == 3) {
          uVar11 = uVar15 + 1;
          uVar7 = (ulong)uVar11;
          iVar10 = *(int *)(lVar2 + lVar16 * 4) + uVar15;
          if ((int)uVar11 < iVar10) {
            do {
              lVar12 = (long)(int)uVar11;
              bVar4 = *(byte *)(lVar3 + lVar12);
              if (bVar4 == 6) {
                bVar19 = *(int *)(lVar2 + lVar12 * 4) == 0x59;
                goto LAB_00385111;
              }
              if (bVar4 == 0) goto LAB_00385245;
              iVar18 = 1;
              if (bVar4 < 4) {
                iVar18 = *(int *)(lVar2 + lVar12 * 4);
              }
              uVar11 = uVar11 + iVar18;
            } while ((int)uVar11 < iVar10);
            bVar19 = false;
LAB_00385111:
            lVar17 = 0;
            lVar12 = 0;
            uVar11 = 0;
            do {
              lVar13 = (long)(int)uVar7;
              bVar4 = *(byte *)(lVar3 + lVar13);
              if (bVar4 == 4) {
                uVar11 = uVar11 + 1;
                iVar18 = 1;
                lVar12 = lVar17;
                if (lVar17 == 0) {
                  lVar12 = lVar2 + lVar13 * 4;
                  lVar17 = lVar12;
                }
              }
              else {
                if (bVar4 == 0) goto LAB_00385245;
                if (lVar12 != 0) break;
                if (bVar4 < 4) {
                  iVar18 = *(int *)(lVar2 + lVar13 * 4);
                }
                else {
                  iVar18 = 1;
                }
                lVar12 = 0;
              }
              uVar6 = (int)uVar7 + iVar18;
              uVar7 = (ulong)uVar6;
            } while ((int)uVar6 < iVar10);
            if (0 < (int)uVar11) {
              uVar8 = 0;
              do {
                iVar10 = *(int *)(lVar17 + uVar8 * 4);
                Vec_IntFillExtra(p,iVar10 + 1,(int)uVar7);
                if (((long)iVar10 < 0) || (p->nSize <= iVar10)) {
LAB_00385264:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                local_48 = p->pArray;
                uVar7 = extraout_RDX;
                if ((local_48[iVar10] == 0) && (!(bool)(bVar19 & (int)uVar8 - 5U < 3))) {
                  printf("Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n"
                         ,(ulong)*(uint *)(lVar17 + uVar8 * 4),uVar8 & 0xffffffff,(ulong)uVar15);
                  uVar7 = extraout_RDX_00;
                }
                uVar8 = uVar8 + 1;
              } while (uVar11 != uVar8);
              lVar3 = *(long *)((long)pData + 8);
              bVar4 = *(byte *)(lVar3 + lVar16);
              goto LAB_003851f2;
            }
          }
          lVar2 = *(long *)((long)pData + 0x10);
LAB_0038520a:
          iVar10 = *(int *)(lVar2 + lVar16 * 4);
        }
        else {
          if (bVar4 == 0) {
LAB_00385245:
            __assert_fail("p->pHead[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/ndr.h"
                          ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
          }
LAB_003851f2:
          if (bVar4 == 0) goto LAB_00385245;
          lVar2 = *(long *)((long)pData + 0x10);
          iVar10 = 1;
          if (bVar4 < 4) goto LAB_0038520a;
        }
        uVar15 = uVar15 + iVar10;
      } while ((int)uVar15 < *(int *)(lVar2 + 8) + 2);
    }
  }
  if (local_48 != (int *)0x0) {
    free(local_48);
  }
  free(p);
  return;
}

Assistant:

void Wln_NtkCheckIntegrity( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vMap = Vec_IntAlloc( 100 );
    int Mod = 2, Obj;
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        if ( NameId == -1 )
        {
            int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
            if ( Type != ABC_OPER_CO )
                printf( "Internal object %d of type %s has no output name.\n", Obj, Abc_OperName(Type) );
            continue;
        }
        if ( Vec_IntGetEntry(vMap, NameId) > 0 )
            printf( "Output name %d is used more than once (obj %d and obj %d).\n", NameId, Vec_IntGetEntry(vMap, NameId), Obj );
        Vec_IntSetEntry( vMap, NameId, Obj );
    }
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int i, * pArray, nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( i = 0; i < nArray; i++ )
            if ( Vec_IntGetEntry(vMap, pArray[i]) == 0 && !(Type == ABC_OPER_DFFRSE && (i >= 5 && i <= 7)) )
                printf( "Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n", pArray[i], i, Obj );
    }
    Vec_IntFree( vMap );
}